

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.h
# Opt level: O3

Ptr __thiscall hwnet::Buffer::New(Buffer *this,char *str,size_t len)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  Ptr PVar1;
  size_t local_50;
  unsigned_long local_48;
  Buffer *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  undefined1 local_29;
  
  if (str == (char *)0x0) {
    (this->buff).super___shared_ptr<hwnet::Buffer::bytes,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (this->buff).super___shared_ptr<hwnet::Buffer::bytes,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    local_48 = 0;
    local_40 = (Buffer *)0x0;
    local_50 = len;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<hwnet::Buffer,std::allocator<hwnet::Buffer>,unsigned_long&,unsigned_long&>
              (&local_38,&local_40,(allocator<hwnet::Buffer> *)&local_29,&local_50,&local_48);
    if (local_40 == (Buffer *)0x0) {
      (this->buff).super___shared_ptr<hwnet::Buffer::bytes,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      (this->buff).super___shared_ptr<hwnet::Buffer::bytes,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      len = (size_t)extraout_RDX;
      if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
        len = (size_t)extraout_RDX_01;
      }
    }
    else {
      Append(local_40,str,len);
      (this->buff).super___shared_ptr<hwnet::Buffer::bytes,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_40;
      (this->buff).super___shared_ptr<hwnet::Buffer::bytes,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = local_38._M_pi;
      len = (size_t)extraout_RDX_00;
    }
  }
  PVar1.super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)len;
  PVar1.super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (Ptr)PVar1.super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static Buffer::Ptr New(const char *str, size_t len) {
		if(!str) {
			return nullptr;
		}
		auto buff = New(len);
		if(buff){
			buff->Append(const_cast<char*>(str),len);
			return buff;
		} else {
			return nullptr;
		}
	}